

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int biseqcstrcaseless(bstring b,char *s)

{
  uint local_30;
  uint local_28;
  int local_24;
  int i;
  char *s_local;
  bstring b_local;
  
  if ((((b == (bstring)0x0) || (s == (char *)0x0)) || (b->data == (uchar *)0x0)) || (b->slen < 0)) {
    b_local._4_4_ = 0xffffffff;
  }
  else {
    for (local_24 = 0; local_24 < b->slen; local_24 = local_24 + 1) {
      if (s[local_24] == '\0') {
        return 0;
      }
      if (b->data[local_24] != s[local_24]) {
        if (b->data[local_24] < 0x80) {
          local_28 = tolower((uint)b->data[local_24]);
        }
        else {
          local_28 = (uint)b->data[local_24];
        }
        if ((byte)s[local_24] < 0x80) {
          local_30 = tolower((int)s[local_24]);
        }
        else {
          local_30 = (uint)s[local_24];
        }
        if (local_28 != (local_30 & 0xff)) {
          return 0;
        }
      }
    }
    b_local._4_4_ = (uint)(s[local_24] == '\0');
  }
  return b_local._4_4_;
}

Assistant:

int biseqcstrcaseless (const bstring b, const char * s) {
int i;
	if (b == NULL || s == NULL || b->data == NULL || b->slen < 0) return BSTR_ERR;
	for (i=0; i < b->slen; i++) {
		if (s[i] == '\0' || 
		    (b->data[i] != (unsigned char) s[i] && 
		     downcase (b->data[i]) != (unsigned char) downcase (s[i])))
			return 0;
	}
	return s[i] == '\0';
}